

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O1

int32_t getDataBlock(UNewTrie2 *trie,UChar32 c,UBool forLSCP)

{
  int32_t *piVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  uint32_t *puVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint32_t *puVar10;
  uint uVar11;
  byte bVar12;
  
  bVar12 = 0;
  iVar3 = getIndex2Block(trie,c,forLSCP);
  if (iVar3 < 0) {
    return -1;
  }
  uVar11 = iVar3 + ((uint)c >> 5 & 0x3f);
  iVar2 = trie->index2[uVar11];
  if ((trie->dataNullOffset != iVar2) && (trie->map[iVar2 >> 5] == 1)) {
    return iVar2;
  }
  uVar9 = trie->firstFreeBlock;
  if (uVar9 == 0) {
    iVar8 = trie->dataCapacity;
    uVar9 = trie->dataLength;
    if (iVar8 < (int)(uVar9 + 0x20)) {
      iVar7 = 0x20000;
      if (0x1ffff < iVar8) {
        uVar4 = 0xffffffff;
        iVar7 = 0x110480;
        if (0x11047f < iVar8) goto LAB_0030bf87;
      }
      puVar5 = (uint32_t *)uprv_malloc_63((ulong)(uint)(iVar7 * 4));
      if (puVar5 == (uint32_t *)0x0) {
        uVar4 = 0xffffffff;
        goto LAB_0030bf87;
      }
      puVar10 = trie->data;
      memcpy(puVar5,puVar10,(long)trie->dataLength << 2);
      uprv_free_63(puVar10);
      trie->data = puVar5;
      trie->dataCapacity = iVar7;
    }
    trie->dataLength = uVar9 + 0x20;
  }
  else {
    trie->firstFreeBlock = -trie->map[(int)uVar9 >> 5];
  }
  puVar5 = trie->data + iVar2;
  puVar10 = trie->data + (int)uVar9;
  for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar10 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar12 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
  }
  trie->map[(int)uVar9 >> 5] = 0;
  uVar4 = uVar9;
LAB_0030bf87:
  uVar9 = 0xffffffff;
  if (-1 < (int)uVar4) {
    trie->map[uVar4 >> 5] = trie->map[uVar4 >> 5] + 1;
    iVar2 = trie->index2[uVar11];
    iVar8 = iVar2 >> 5;
    piVar1 = trie->map + iVar8;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      trie->map[iVar8] = -trie->firstFreeBlock;
      trie->firstFreeBlock = iVar2;
    }
    trie->index2[uVar11] = uVar4;
    uVar9 = uVar4;
  }
  return uVar9;
}

Assistant:

static int32_t
getDataBlock(UNewTrie2 *trie, UChar32 c, UBool forLSCP) {
    int32_t i2, oldBlock, newBlock;

    i2=getIndex2Block(trie, c, forLSCP);
    if(i2<0) {
        return -1;  /* program error */
    }

    i2+=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
    oldBlock=trie->index2[i2];
    if(isWritableBlock(trie, oldBlock)) {
        return oldBlock;
    }

    /* allocate a new data block */
    newBlock=allocDataBlock(trie, oldBlock);
    if(newBlock<0) {
        /* out of memory in the data array */
        return -1;
    }
    setIndex2Entry(trie, i2, newBlock);
    return newBlock;
}